

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall
Rml::BaseXMLParser::ReadAttributes
          (BaseXMLParser *this,XMLAttributes *attributes,bool *parse_raw_xml_content)

{
  bool bVar1;
  size_t sVar2;
  type this_00;
  String local_98;
  int local_78;
  undefined1 local_68 [8];
  String value;
  String attribute;
  bool *parse_raw_xml_content_local;
  XMLAttributes *attributes_local;
  BaseXMLParser *this_local;
  
  do {
    ::std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)local_68);
    bVar1 = FindWord(this,(String *)(value.field_2._M_local_buf + 8),"=/>");
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_78 = 1;
      goto LAB_004bb700;
    }
    bVar1 = PeekString(this,"=",true);
    if (bVar1) {
      bVar1 = PeekString(this,"\"",true);
      if (bVar1) {
        bVar1 = FindString(this,"\"",(String *)local_68,false);
        if (!bVar1) {
          this_local._7_1_ = 0;
          local_78 = 1;
          goto LAB_004bb700;
        }
        goto LAB_004bb603;
      }
      bVar1 = PeekString(this,"\'",true);
      if (bVar1) {
        bVar1 = FindString(this,"\'",(String *)local_68,false);
        if (bVar1) goto LAB_004bb603;
        this_local._7_1_ = 0;
        local_78 = 1;
      }
      else {
        bVar1 = FindWord(this,(String *)local_68,"/>");
        if (bVar1) goto LAB_004bb603;
        this_local._7_1_ = 0;
        local_78 = 1;
      }
    }
    else {
LAB_004bb603:
      sVar2 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::count<std::__cxx11::string>
                        ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&this->attributes_for_inner_xml_data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value.field_2 + 8));
      if (sVar2 == 1) {
        *parse_raw_xml_content = true;
      }
      StringUtilities::DecodeRml(&local_98,(String *)local_68);
      this_00 = itlib::
                flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                ::operator[]<std::__cxx11::string&>
                          ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                            *)attributes,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value.field_2 + 8));
      Variant::operator=(this_00,&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      bVar1 = PeekString(this,"/",false);
      if ((bVar1) || (bVar1 = PeekString(this,">",false), bVar1)) {
        this_local._7_1_ = 1;
        local_78 = 1;
      }
      else {
        local_78 = 0;
      }
    }
LAB_004bb700:
    ::std::__cxx11::string::~string((string *)local_68);
    ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    if (local_78 != 0) {
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool BaseXMLParser::ReadAttributes(XMLAttributes& attributes, bool& parse_raw_xml_content)
{
	for (;;)
	{
		String attribute;
		String value;

		// Get the attribute name
		if (!FindWord(attribute, "=/>"))
		{
			return false;
		}

		// Check if theres an assigned value
		if (PeekString("="))
		{
			if (PeekString("\""))
			{
				if (!FindString("\"", value))
					return false;
			}
			else if (PeekString("'"))
			{
				if (!FindString("'", value))
					return false;
			}
			else if (!FindWord(value, "/>"))
			{
				return false;
			}
		}

		if (attributes_for_inner_xml_data.count(attribute) == 1)
			parse_raw_xml_content = true;

		attributes[attribute] = StringUtilities::DecodeRml(value);

		// Check for the end of the tag.
		if (PeekString("/", false) || PeekString(">", false))
			return true;
	}
}